

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

int run_test_fs_poll_close_request(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  
  remove("testfile");
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(&loop,&poll_handle);
    if (iVar1 == 0) {
      iVar1 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&poll_handle,close_cb);
        while (close_cb_called == 0) {
          uv_run(&loop,UV_RUN_ONCE);
        }
        if (close_cb_called == 1) {
          iVar1 = uv_loop_close(&loop);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
            uVar3 = 0xd9;
          }
          else {
            pcVar4 = "0 == uv_loop_close(&loop)";
            uVar3 = 0xd7;
          }
        }
        else {
          pcVar4 = "close_cb_called == 1";
          uVar3 = 0xd5;
        }
      }
      else {
        pcVar4 = "0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100)";
        uVar3 = 0xd1;
      }
    }
    else {
      pcVar4 = "0 == uv_fs_poll_init(&loop, &poll_handle)";
      uVar3 = 0xd0;
    }
  }
  else {
    pcVar4 = "0 == uv_loop_init(&loop)";
    uVar3 = 0xce;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-poll.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_poll_close_request) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;

  remove(FIXTURE);

  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_fs_poll_init(&loop, &poll_handle));
  ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT(close_cb_called == 1);

  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}